

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O1

TimestampComponents *
duckdb::Timestamp::GetComponents(TimestampComponents *__return_storage_ptr__,timestamp_t timestamp)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  date_t date;
  dtime_t time;
  date_t local_24;
  dtime_t local_20;
  
  Convert(timestamp,&local_24,&local_20);
  Date::Convert(local_24,&__return_storage_ptr__->year,&__return_storage_ptr__->month,
                &__return_storage_ptr__->day);
  iVar2 = (int)(local_20.micros / 3600000000);
  __return_storage_ptr__->hour = iVar2;
  lVar3 = (long)iVar2 * -3600000000 + local_20.micros;
  iVar2 = (int)(lVar3 / 60000000);
  __return_storage_ptr__->minute = iVar2;
  lVar3 = (long)iVar2 * -60000000 + lVar3;
  auVar1 = SEXT816(lVar3) * SEXT816(0x431bde82d7b634db);
  iVar2 = (int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f);
  __return_storage_ptr__->second = iVar2;
  __return_storage_ptr__->microsecond = (int)lVar3 + iVar2 * -1000000;
  return __return_storage_ptr__;
}

Assistant:

TimestampComponents Timestamp::GetComponents(timestamp_t timestamp) {
	date_t date;
	dtime_t time;

	Convert(timestamp, date, time);

	TimestampComponents result;
	Date::Convert(date, result.year, result.month, result.day);
	Time::Convert(time, result.hour, result.minute, result.second, result.microsecond);
	return result;
}